

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogParser.cpp
# Opt level: O0

void __thiscall xe::TestLogParser::reset(TestLogParser *this)

{
  SessionInfo local_f0;
  TestLogParser *local_10;
  TestLogParser *this_local;
  
  local_10 = this;
  ContainerFormatParser::clear(&this->m_containerParser);
  de::SharedPtr<xe::TestCaseResultData>::clear(&this->m_currentCaseData);
  memset(&local_f0,0,0xe0);
  SessionInfo::SessionInfo(&local_f0);
  SessionInfo::operator=(&this->m_sessionInfo,&local_f0);
  SessionInfo::~SessionInfo(&local_f0);
  this->m_inSession = false;
  return;
}

Assistant:

void TestLogParser::reset (void)
{
	m_containerParser.clear();
	m_currentCaseData.clear();
	m_sessionInfo	= SessionInfo();
	m_inSession		= false;
}